

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O0

PointSet * __thiscall hnsw::HNSWIndex::Search(HNSWIndex *this,uint32_t K,float *query)

{
  float *pfVar1;
  undefined8 in_RCX;
  MaxHeap *in_RSI;
  Matrix *in_RDI;
  MaxHeap candidates;
  uint32_t ef_search;
  layer_t l;
  Point ep;
  PointSet *result;
  size_t in_stack_ffffffffffffff58;
  undefined8 *puVar2;
  pointer *__x;
  uint32_t M;
  float *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  layer_t in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  float *in_stack_ffffffffffffffa8;
  HNSWIndex *in_stack_ffffffffffffffb0;
  int local_30;
  float local_2c;
  pair<unsigned_int,_float> local_28 [2];
  uint local_14 [5];
  
  __x = &in_RSI[1].super_MaxHeapImpl.c.
         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = *(undefined8 **)&in_RSI[5].super_MaxHeapImpl.field_0x18;
  pfVar1 = Matrix::operator[](in_RDI,in_stack_ffffffffffffff58);
  local_2c = (float)(**(code **)*puVar2)(puVar2,in_RCX,pfVar1);
  std::pair<unsigned_int,_float>::pair<unsigned_int_&,_float,_true>(local_28,(uint *)__x,&local_2c);
  for (local_30 = *(int *)((long)&in_RSI[1].super_MaxHeapImpl.c.
                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
      M = (uint32_t)((ulong)__x >> 0x20), 0 < local_30; local_30 = local_30 + -1) {
    SearchUpperLayer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     (Point *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
  }
  std::max<unsigned_int>((uint *)(in_RSI + 1),local_14);
  SearchLayer((HNSWIndex *)candidates.super_MaxHeapImpl._24_8_,
              (float *)candidates.super_MaxHeapImpl.c.
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
              candidates.super_MaxHeapImpl.c.
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
              candidates.super_MaxHeapImpl.c.
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_,
              (uint32_t)
              candidates.super_MaxHeapImpl.c.
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ._M_impl.super__Vector_impl_data._M_start);
  SelectNeighbors((HNSWIndex *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                  in_stack_ffffffffffffff90,in_RSI,M);
  MaxHeap::~MaxHeap((MaxHeap *)0x113673);
  return (PointSet *)in_RDI;
}

Assistant:

PointSet Search(uint32_t K, const float *query) {
    Point ep(ep_, distance_(query, points_[ep_]));
    for (layer_t l = top_layer_; l > 0; l--) {
      SearchUpperLayer(query, ep, l);
    }

    uint32_t ef_search = std::max(ef_search_, K);
    MaxHeap candidates = SearchLayer(query, ep, ef_search, 0);
    PointSet result = SelectNeighbors(query, candidates, K);

    return result;
  }